

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O3

bool __thiscall Pig::getDecimal(Pig *this,string *result)

{
  pointer pcVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  element_type *peVar5;
  size_type sVar6;
  size_type sVar7;
  long *local_40 [2];
  long local_30 [2];
  
  sVar6 = this->_cursor;
  pcVar1 = (((this->_text).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_M_dataplus)._M_p;
  cVar4 = pcVar1[sVar6];
  if ((cVar4 == '-') || (cVar4 == '+')) {
    cVar4 = pcVar1[sVar6 + 1];
    sVar6 = sVar6 + 1;
  }
  if ((cVar4 == '\0') || (bVar3 = unicodeLatinDigit((int)cVar4), !bVar3)) {
    bVar3 = false;
  }
  else {
    sVar6 = sVar6 + 1;
    do {
      sVar7 = sVar6;
      peVar5 = (this->_text).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      cVar4 = (peVar5->_M_dataplus)._M_p[sVar7];
      if (cVar4 == '\0') goto LAB_00112fbb;
      bVar3 = unicodeLatinDigit((int)cVar4);
      sVar6 = sVar7 + 1;
    } while (bVar3);
    peVar5 = (this->_text).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pcVar1 = (peVar5->_M_dataplus)._M_p;
    if (pcVar1[sVar7] == '.') {
      cVar4 = pcVar1[sVar6];
      while (sVar7 = sVar6, cVar4 != '\0') {
        bVar3 = unicodeLatinDigit((int)cVar4);
        peVar5 = (this->_text).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (!bVar3) break;
        lVar2 = sVar6 + 1;
        sVar6 = sVar6 + 1;
        cVar4 = (peVar5->_M_dataplus)._M_p[lVar2];
      }
    }
LAB_00112fbb:
    std::__cxx11::string::substr((ulong)local_40,(ulong)peVar5);
    std::__cxx11::string::operator=((string *)result,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    this->_cursor = sVar7;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Pig::getDecimal (std::string& result)
{
  auto i = _cursor;

  // [+-]?
  if ((*_text)[i] &&
      ((*_text)[i] == '-' ||
       (*_text)[i] == '+'))
    ++i;

  // digit+
  if ((*_text)[i] && unicodeLatinDigit ((*_text)[i]))
  {
    ++i;

    while ((*_text)[i] && unicodeLatinDigit ((*_text)[i]))
      ++i;

    // ( . digit+ )?
    if ((*_text)[i] && (*_text)[i] == '.')
    {
      ++i;

      while ((*_text)[i] && unicodeLatinDigit ((*_text)[i]))
        ++i;
    }

    result = _text->substr (_cursor, i - _cursor);
    _cursor = i;
    return true;
  }

  return false;
}